

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

bool __thiscall
ON_Plane::CreateFromNormalYup(ON_Plane *this,ON_3dPoint *P,ON_3dVector *N,ON_3dVector *Y)

{
  bool bVar1;
  byte local_61;
  ON_3dVector local_60;
  ON_3dVector local_48;
  byte local_29;
  ON_3dVector *pOStack_28;
  bool b;
  ON_3dVector *Y_local;
  ON_3dVector *N_local;
  ON_3dPoint *P_local;
  ON_Plane *this_local;
  
  (this->origin).x = P->x;
  (this->origin).y = P->y;
  (this->origin).z = P->z;
  (this->zaxis).x = N->x;
  (this->zaxis).y = N->y;
  (this->zaxis).z = N->z;
  pOStack_28 = Y;
  Y_local = N;
  N_local = (ON_3dVector *)P;
  P_local = &this->origin;
  local_29 = ON_3dVector::Unitize(&this->zaxis);
  ON_CrossProduct(&local_48,pOStack_28,&this->zaxis);
  (this->xaxis).x = local_48.x;
  (this->xaxis).y = local_48.y;
  (this->xaxis).z = local_48.z;
  bVar1 = ON_3dVector::Unitize(&this->xaxis);
  local_61 = 0;
  if (bVar1) {
    local_61 = local_29;
  }
  local_29 = local_61 & 1;
  bVar1 = ON_3dVector::Unitize(&this->xaxis);
  if (!bVar1) {
    ON_3dVector::PerpendicularTo(&this->xaxis,&this->zaxis);
    ON_3dVector::Unitize(&this->xaxis);
  }
  ON_CrossProduct(&local_60,&this->zaxis,&this->xaxis);
  (this->yaxis).x = local_60.x;
  (this->yaxis).y = local_60.y;
  (this->yaxis).z = local_60.z;
  ON_3dVector::Unitize(&this->yaxis);
  UpdateEquation(this);
  return (bool)(local_29 & 1);
}

Assistant:

bool ON_Plane::CreateFromNormalYup(
  const ON_3dPoint& P,
  const ON_3dVector& N,
  const ON_3dVector& Y
)
{
  origin = P;
  zaxis = N;
  bool b = zaxis.Unitize();
  xaxis = ON_CrossProduct(Y, zaxis);
  b = xaxis.Unitize() && b;
  if (!xaxis.Unitize())
  {
    xaxis.PerpendicularTo(zaxis);
    xaxis.Unitize();
  }

  yaxis = ON_CrossProduct(zaxis, xaxis);
  yaxis.Unitize();
  UpdateEquation();

  return b;
}